

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalCreateDummyThread
                    (CPalThread *pThread,LPSECURITY_ATTRIBUTES lpThreadAttributes,
                    CPalThread **ppDummyThread,HANDLE *phThread)

{
  bool bVar1;
  undefined1 local_70 [7];
  bool fThreadDataStoredInObject;
  CObjectAttributes oa;
  CThreadProcessLocalData *pLocalData;
  IDataLock *pDataLock;
  IPalObject *pobjThreadRegistered;
  IPalObject *pobjThread;
  CPalThread *pDummyThread;
  HANDLE *ppVStack_28;
  PAL_ERROR palError;
  HANDLE *phThread_local;
  CPalThread **ppDummyThread_local;
  LPSECURITY_ATTRIBUTES lpThreadAttributes_local;
  CPalThread *pThread_local;
  
  pDummyThread._4_4_ = 0;
  pobjThread = (IPalObject *)0x0;
  pobjThreadRegistered = (IPalObject *)0x0;
  pDataLock = (IDataLock *)0x0;
  ppVStack_28 = phThread;
  phThread_local = ppDummyThread;
  ppDummyThread_local = (CPalThread **)lpThreadAttributes;
  lpThreadAttributes_local = (LPSECURITY_ATTRIBUTES)pThread;
  CObjectAttributes::CObjectAttributes
            ((CObjectAttributes *)local_70,(WCHAR *)0x0,lpThreadAttributes);
  bVar1 = false;
  pobjThread = (IPalObject *)AllocTHREAD();
  if ((CPalThread *)pobjThread == (CPalThread *)0x0) {
    pDummyThread._4_4_ = 0xe;
  }
  else {
    ((CPalThread *)pobjThread)->m_fIsDummy = true;
    pDummyThread._4_4_ =
         (**(code **)*g_pObjectManager)
                   (g_pObjectManager,lpThreadAttributes_local,otThread,local_70,
                    &pobjThreadRegistered);
    if ((pDummyThread._4_4_ == 0) &&
       (pDummyThread._4_4_ =
             (*pobjThreadRegistered->_vptr_IPalObject[3])
                       (pobjThreadRegistered,lpThreadAttributes_local,1,&pLocalData,
                        &oa.pSecurityAttributes), pDummyThread._4_4_ == 0)) {
      *(IPalObject **)oa.pSecurityAttributes = pobjThread;
      (*(code *)pLocalData->pThread->_vptr_CPalThread)(pLocalData,lpThreadAttributes_local,1);
      bVar1 = true;
      pDummyThread._4_4_ =
           (**(code **)(*g_pObjectManager + 8))
                     (g_pObjectManager,lpThreadAttributes_local,pobjThreadRegistered,&aotThread,0,
                      ppVStack_28,&pDataLock);
      pobjThreadRegistered = (IPalObject *)0x0;
      if (pDummyThread._4_4_ == 0) {
        *phThread_local = pobjThread;
      }
    }
  }
  if (pDataLock != (IDataLock *)0x0) {
    (*pDataLock->_vptr_IDataLock[8])(pDataLock,lpThreadAttributes_local);
  }
  if (pobjThreadRegistered != (IPalObject *)0x0) {
    (*pobjThreadRegistered->_vptr_IPalObject[8])(pobjThreadRegistered,lpThreadAttributes_local);
  }
  if (((pDummyThread._4_4_ != 0) && (pobjThread != (IPalObject *)0x0)) && (!bVar1)) {
    CPalThread::ReleaseThreadReference((CPalThread *)pobjThread);
  }
  return pDummyThread._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateDummyThread(
    CPalThread *pThread,
    LPSECURITY_ATTRIBUTES lpThreadAttributes,
    CPalThread **ppDummyThread,
    HANDLE *phThread
    )
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pDummyThread = NULL;
    IPalObject *pobjThread = NULL;
    IPalObject *pobjThreadRegistered = NULL;
    IDataLock *pDataLock;
    CThreadProcessLocalData *pLocalData;
    CObjectAttributes oa(NULL, lpThreadAttributes);
    bool fThreadDataStoredInObject = FALSE;

    pDummyThread = AllocTHREAD();
    if (NULL == pDummyThread)
    {
        palError = ERROR_OUTOFMEMORY;
        goto InternalCreateDummyThreadExit;
    }

    pDummyThread->m_fIsDummy = TRUE;

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otThread,
        &oa,
        &pobjThread
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreateDummyThreadExit;
    }

    palError = pobjThread->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreateDummyThreadExit;
    }

    pLocalData->pThread = pDummyThread;
    pDataLock->ReleaseLock(pThread, TRUE);
    fThreadDataStoredInObject = TRUE;

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pobjThread,
        &aotThread,
        0, // THREAD_ALL_ACCESS
        phThread,
        &pobjThreadRegistered
        );

    //
    // pobjThread is invalidated by the above call, so NULL
    // it out here
    //

    pobjThread = NULL;

    if (NO_ERROR != palError)
    {
        goto InternalCreateDummyThreadExit;
    }

    //
    // Note the we do NOT store the registered object for the
    // thread w/in pDummyThread. Since this thread is not actually
    // executing that reference would never be released (and thus
    // the thread object would never be cleaned up...)
    //

    *ppDummyThread = pDummyThread;

InternalCreateDummyThreadExit:

    if (NULL != pobjThreadRegistered)
    {
        pobjThreadRegistered->ReleaseReference(pThread);
    }

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pThread);
    }

    if (NO_ERROR != palError
        && NULL != pDummyThread
        && !fThreadDataStoredInObject)
    {
        pDummyThread->ReleaseThreadReference();
    }

    return palError;
}